

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O2

long uv__idna_toascii(char *s,char *se,char *d,char *de)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *si;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_48 = d;
  local_40 = d;
  local_38 = s;
  while (pcVar3 = local_38, local_38 < se) {
    uVar1 = uv__utf8_decode1(&local_38,se);
    if ((((uVar1 == 0x2e) || (uVar1 == 0x3002)) || (uVar1 == 0xff61)) || (uVar1 == 0xff0e)) {
      iVar2 = uv__idna_toascii_label(s,pcVar3,&local_48,de);
      if (iVar2 < 0) goto LAB_0012f7b8;
      s = local_38;
      d = local_48;
      if (local_48 < de) {
        d = local_48 + 1;
        *local_48 = '.';
        local_48 = d;
      }
    }
  }
  if ((s < se) && (iVar2 = uv__idna_toascii_label(s,se,&local_48,de), d = local_48, iVar2 < 0)) {
LAB_0012f7b8:
    lVar4 = (long)iVar2;
  }
  else {
    pcVar3 = d;
    if (d < de) {
      pcVar3 = d + 1;
      *d = '\0';
    }
    lVar4 = (long)pcVar3 - (long)local_40;
  }
  return lVar4;
}

Assistant:

long uv__idna_toascii(const char* s, const char* se, char* d, char* de) {
  const char* si;
  const char* st;
  unsigned c;
  char* ds;
  int rc;

  ds = d;

  for (si = s; si < se; /* empty */) {
    st = si;
    c = uv__utf8_decode1(&si, se);

    if (c != '.')
      if (c != 0x3002)  /* 。 */
        if (c != 0xFF0E)  /* ． */
          if (c != 0xFF61)  /* ｡ */
            continue;

    rc = uv__idna_toascii_label(s, st, &d, de);

    if (rc < 0)
      return rc;

    if (d < de)
      *d++ = '.';

    s = si;
  }

  if (s < se) {
    rc = uv__idna_toascii_label(s, se, &d, de);

    if (rc < 0)
      return rc;
  }

  if (d < de)
    *d++ = '\0';

  return d - ds;  /* Number of bytes written. */
}